

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O2

bool __thiscall i2p::sam::Session::Accept(Session *this,Connection *conn)

{
  long lVar1;
  _Head_base<0UL,_Sock_*,_false> _Var2;
  bool bVar3;
  char cVar4;
  Level level;
  Connection *pCVar5;
  int iVar6;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  Event occurred;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock9;
  CNetAddr peer_addr;
  string peer_dest;
  string errmsg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  errmsg._M_dataplus._M_p = (pointer)&errmsg.field_2;
  errmsg._M_string_length = 0;
  errmsg.field_2._M_local_buf[0] = '\0';
  pCVar5 = conn;
  do {
    level = (Level)pCVar5;
    bVar3 = CThreadInterrupt::operator_cast_to_bool(this->m_interrupt);
    if (bVar3) goto LAB_006d56d4;
    _Var2._M_head_impl =
         (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
         super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
         super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
    pCVar5 = (Connection *)&DAT_000003e8;
    cVar4 = (**(code **)((long)(_Var2._M_head_impl)->_vptr_Sock + 0x70))
                      (_Var2._M_head_impl,1000,1,&occurred);
    if (cVar4 == '\0') {
      level = 0xc8e954;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&errmsg,"wait on socket failed");
      goto LAB_006d56d4;
    }
    if (occurred == '\0') {
      iVar6 = 2;
    }
    else {
      peer_dest._M_dataplus._M_p = (pointer)&peer_dest.field_2;
      peer_dest._M_string_length = 0;
      peer_dest.field_2._M_local_buf[0] = '\0';
      _Var2._M_head_impl =
           (conn->sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
           super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_Sock + 0x90))
                ((Connection *)&criticalblock9,_Var2._M_head_impl,10,1000,this->m_interrupt);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&peer_dest,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &criticalblock9);
      std::__cxx11::string::~string((string *)&criticalblock9);
      CNetAddr::CNetAddr(&peer_addr);
      DecodeI2PBase64((Binary *)&local_d8,&peer_dest);
      DestBinToAddr((CNetAddr *)&criticalblock9,(Binary *)&local_d8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d8);
      CNetAddr::operator=(&peer_addr,(CNetAddr *)&criticalblock9);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock9);
      CService::CService((CService *)&criticalblock9,&peer_addr,0);
      pCVar5 = (Connection *)&criticalblock9;
      CService::operator=(&conn->peer,(CService *)&criticalblock9);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock9);
      iVar6 = 1;
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&peer_addr.m_addr);
      std::__cxx11::string::~string((string *)&peer_dest);
    }
    level = (Level)pCVar5;
  } while (iVar6 == 2);
  if (iVar6 == 3) {
LAB_006d56d4:
    bVar3 = CThreadInterrupt::operator_cast_to_bool(this->m_interrupt);
    if (bVar3) {
      bVar3 = ::LogAcceptCategory(NET,level);
      if (bVar3) {
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
        ;
        source_file._M_len = 0x57;
        logging_function._M_str = "Accept";
        logging_function._M_len = 6;
        LogPrintFormatInternal<>
                  (logging_function,source_file,0xd0,I2P,Debug,(ConstevalFormatString<0U>)0xc8e9ba);
      }
    }
    else {
      bVar3 = ::LogAcceptCategory(NET,level);
      if (bVar3) {
        criticalblock9.super_unique_lock._M_device = (mutex_type *)0xc694e1;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/i2p.cpp"
        ;
        source_file_00._M_len = 0x57;
        logging_function_00._M_str = "Accept";
        logging_function_00._M_len = 6;
        LogPrintFormatInternal<char_const*,std::__cxx11::string>
                  (logging_function_00,source_file_00,0xd2,I2P,Debug,
                   (ConstevalFormatString<2U>)0xc8e9d2,(char **)&criticalblock9,&errmsg);
      }
    }
    CheckControlSock(this);
    bVar3 = false;
  }
  else {
    bVar3 = true;
  }
  std::__cxx11::string::~string((string *)&errmsg);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool Session::Accept(Connection& conn)
{
    AssertLockNotHeld(m_mutex);

    std::string errmsg;
    bool disconnect{false};

    while (!*m_interrupt) {
        Sock::Event occurred;
        if (!conn.sock->Wait(MAX_WAIT_FOR_IO, Sock::RECV, &occurred)) {
            errmsg = "wait on socket failed";
            break;
        }

        if (occurred == 0) {
            // Timeout, no incoming connections or errors within MAX_WAIT_FOR_IO.
            continue;
        }

        std::string peer_dest;
        try {
            peer_dest = conn.sock->RecvUntilTerminator('\n', MAX_WAIT_FOR_IO, *m_interrupt, MAX_MSG_SIZE);
        } catch (const std::runtime_error& e) {
            errmsg = e.what();
            break;
        }

        CNetAddr peer_addr;
        try {
            peer_addr = DestB64ToAddr(peer_dest);
        } catch (const std::runtime_error& e) {
            // The I2P router is expected to send the Base64 of the connecting peer,
            // but it may happen that something like this is sent instead:
            // STREAM STATUS RESULT=I2P_ERROR MESSAGE="Session was closed"
            // In that case consider the session damaged and close it right away,
            // even if the control socket is alive.
            if (peer_dest.find("RESULT=I2P_ERROR") != std::string::npos) {
                errmsg = strprintf("unexpected reply that hints the session is unusable: %s", peer_dest);
                disconnect = true;
            } else {
                errmsg = e.what();
            }
            break;
        }

        conn.peer = CService(peer_addr, I2P_SAM31_PORT);

        return true;
    }

    if (*m_interrupt) {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Accept was interrupted\n");
    } else {
        LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Error accepting%s: %s\n", disconnect ? " (will close the session)" : "", errmsg);
    }
    if (disconnect) {
        LOCK(m_mutex);
        Disconnect();
    } else {
        CheckControlSock();
    }
    return false;
}